

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O0

void __thiscall
boost::shared_ptr<boost::unit_test::decorator::base>::
shared_ptr<boost::unit_test::decorator::depends_on>
          (shared_ptr<boost::unit_test::decorator::base> *this,depends_on *p)

{
  sp_counted_base *in_RSI;
  shared_count *in_RDI;
  depends_on *p_00;
  shared_ptr<boost::unit_test::decorator::base> *in_stack_ffffffffffffffe0;
  
  in_RDI->pi_ = in_RSI;
  p_00 = (depends_on *)(in_RDI + 1);
  detail::shared_count::shared_count((shared_count *)p_00);
  detail::
  sp_pointer_construct<boost::unit_test::decorator::base,boost::unit_test::decorator::depends_on>
            (in_stack_ffffffffffffffe0,p_00,in_RDI);
  return;
}

Assistant:

explicit shared_ptr( Y * p ): px( p ), pn() // Y must be complete
    {
        boost::detail::sp_pointer_construct( this, p, pn );
    }